

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O3

string * format_literal(string *__return_storage_ptr__,string *literal)

{
  long lVar1;
  _Alloc_hider *p_Var2;
  bool bVar3;
  pointer psVar4;
  long *plVar5;
  string *extraout_RAX;
  string *psVar6;
  size_type *psVar7;
  long in_RDX;
  smatch match;
  string escaped;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  long local_68 [2];
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  string *local_38;
  
  local_58 = 0;
  uStack_50 = 0;
  local_40 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json-schema-to-grammar.cpp:337:78)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json-schema-to-grammar.cpp:337:78)>
             ::_M_manager;
  local_b8._16_8_ = (pointer)0x0;
  local_b8._24_8_ = (char *)0x0;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  local_98._0_8_ = local_98 + 0x10;
  local_98._8_8_ = 0;
  local_98[0x10] = '\0';
  p_Var2 = &literal->_M_dataplus;
  local_38 = __return_storage_ptr__;
  while( true ) {
    bVar3 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )literal,(char *)((long)&p_Var2->_M_p + in_RDX),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_b8,&GRAMMAR_LITERAL_ESCAPE_RE_abi_cxx11_,0);
    if (!bVar3) {
      std::__cxx11::string::replace((ulong)local_98,local_98._8_8_,(char *)0x0,(ulong)literal);
      psVar6 = local_38;
      if ((pointer)local_b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
      }
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,3);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     "\"",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_98);
      plVar5 = (long *)std::__cxx11::string::append(local_b8);
      (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        lVar1 = plVar5[3];
        (psVar6->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&psVar6->field_2 + 8) = lVar1;
      }
      else {
        (psVar6->_M_dataplus)._M_p = (pointer)*plVar5;
        (psVar6->field_2)._M_allocated_capacity = *psVar7;
      }
      psVar6->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
      }
      psVar6 = (string *)(local_98 + 0x10);
      if ((string *)local_98._0_8_ != psVar6) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
        psVar6 = extraout_RAX;
      }
      return psVar6;
    }
    std::__cxx11::string::replace((ulong)local_98,local_98._8_8_,(char *)0x0,(ulong)literal);
    if (local_48 == (code *)0x0) break;
    (*local_40)(&local_78,&local_58,local_b8);
    std::__cxx11::string::_M_append(local_98,local_78._M_allocated_capacity);
    if ((long *)local_78._M_allocated_capacity != local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68[0] + 1);
    }
    psVar4 = (pointer)(local_b8._8_8_ + -0x48);
    if (3 < (ulong)(((long)(local_b8._8_8_ - local_b8._0_8_) >> 3) * -0x5555555555555555)) {
      psVar4 = (pointer)(local_b8._8_8_ + -0x18);
    }
    literal = (string *)
              (psVar4->
              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).first._M_current;
  }
  std::__throw_bad_function_call();
}

Assistant:

static std::string format_literal(const std::string & literal) {
    std::string escaped = replacePattern(literal, GRAMMAR_LITERAL_ESCAPE_RE, [&](const std::smatch & match) {
        char c = match.str()[0];
        return GRAMMAR_LITERAL_ESCAPES.at(c);
    });
    return "\"" + escaped + "\"";
}